

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

void __thiscall Env_HomeDir_Test::TestBody(Env_HomeDir_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  Message local_90;
  undefined4 local_88;
  allocator local_81;
  string local_80 [32];
  string local_60 [48];
  undefined1 local_30 [8];
  string home;
  Env_HomeDir_Test *this_local;
  
  home.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"~",&local_81);
      arbiter::expandTilde(local_60,local_80);
      std::__cxx11::string::operator=((string *)local_30,local_60);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    testing::internal::CmpHelperNE<std::__cxx11::string,char[2]>
              ((internal *)local_a8,"home","\"~\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               (char (*) [2])"~");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
                 ,0x13,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    bVar2 = std::__cxx11::string::empty();
    testing::AssertionResult::AssertionResult((AssertionResult *)local_c8,(bool)(bVar2 ^ 1));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_f8,(internal *)local_c8,(AssertionResult *)"home.empty()","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
                 ,0x14,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      testing::Message::~Message(&local_d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    local_88 = 0;
  }
  else {
    testing::Message::Message(&local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x12,
               "Expected: home = arbiter::expandTilde(\"~\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_90);
    local_88 = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Env, HomeDir)
{
    std::string home;

    ASSERT_NO_THROW(home = arbiter::expandTilde("~"));
    EXPECT_NE(home, "~");
    EXPECT_FALSE(home.empty());
}